

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.hpp
# Opt level: O0

mat<4,_4,_float,_(glm::qualifier)0> * __thiscall
glm::toMat4<float,(glm::qualifier)0>
          (mat<4,_4,_float,_(glm::qualifier)0> *__return_storage_ptr__,glm *this,
          qua<float,_(glm::qualifier)0> *x)

{
  qua<float,_(glm::qualifier)0> *x_local;
  
  mat4_cast<float,(glm::qualifier)0>(__return_storage_ptr__,this,x);
  return __return_storage_ptr__;
}

Assistant:

GLM_FUNC_DECL mat<4, 4, T, Q> toMat4(
		qua<T, Q> const& x){return mat4_cast(x);}